

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::EnumOptions::Clear(EnumOptions *this)

{
  undefined8 uVar1;
  ExtensionSet *in_RDI;
  uint32 cached_has_bits;
  
  internal::ExtensionSet::Clear(in_RDI);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::Clear
            ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)0x51fc22);
  memset(in_RDI + 3,0,2);
  memset(&in_RDI[1].map_,0,4);
  uVar1._0_2_ = in_RDI[1].flat_capacity_;
  uVar1._2_2_ = in_RDI[1].flat_size_;
  uVar1._4_4_ = *(undefined4 *)&in_RDI[1].field_0xc;
  if (((uint)uVar1 & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear((InternalMetadataWithArena *)in_RDI);
  }
  return;
}

Assistant:

void EnumOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.EnumOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  uninterpreted_option_.Clear();
  ::memset(&allow_alias_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&deprecated_) -
      reinterpret_cast<char*>(&allow_alias_)) + sizeof(deprecated_));
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}